

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O3

size_t __thiscall proto3::TestMessage::ByteSizeLong(TestMessage *this)

{
  void **ppvVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar13;
  Rep *pRVar14;
  long lVar15;
  long lVar16;
  RepeatedPtrField<proto3::MessageType> *this_00;
  int n;
  RepeatedPtrField<proto3::MessageType> *pRVar17;
  undefined1 auVar18 [16];
  
  uVar4 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_bool_value_.soo_rep_,
                     (undefined1  [384])((undefined1  [384])this->field_0 & (undefined1  [384])0x4)
                     == (undefined1  [384])0x0);
  if (uVar4 == 0) {
    lVar15 = 0;
  }
  else {
    lVar15 = 0x3f;
    if ((long)(int)(uVar4 | 1) != 0) {
      for (; (ulong)(long)(int)(uVar4 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    lVar15 = (ulong)((int)lVar15 * 9 + 0x49U >> 6) + 2;
  }
  sVar7 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_int32_value_,2,
                     &(this->field_0)._impl_._repeated_int32_value_cached_byte_size_);
  sVar8 = google::protobuf::internal::WireFormatLite::Int64SizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_int64_value_,2,
                     &(this->field_0)._impl_._repeated_int64_value_cached_byte_size_);
  sVar9 = google::protobuf::internal::WireFormatLite::UInt32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_uint32_value_,2,
                     &(this->field_0)._impl_._repeated_uint32_value_cached_byte_size_);
  sVar10 = google::protobuf::internal::WireFormatLite::UInt64SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_uint64_value_,2,
                      &(this->field_0)._impl_._repeated_uint64_value_cached_byte_size_);
  uVar5 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_float_value_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0x78) & 4) == 0);
  if (uVar5 == 0) {
    lVar16 = 0;
  }
  else {
    uVar11 = ((long)((ulong)uVar5 << 0x22) >> 0x20) + 1;
    lVar16 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    lVar16 = (ulong)((int)lVar16 * 9 + 0x49U >> 6) + 2;
  }
  uVar6 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_double_value_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0x88) & 4) == 0);
  if (uVar6 == 0) {
    lVar12 = 0;
  }
  else {
    uVar11 = ((long)((ulong)uVar6 << 0x23) >> 0x20) + 1;
    lVar12 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    lVar12 = (ulong)((int)lVar12 * 9 + 0x49U >> 6) + 2;
  }
  uVar2 = *(uint *)((long)&this->field_0 + 0xa0);
  lVar15 = (ulong)uVar5 * 4 + lVar16 + sVar7 + sVar8 + sVar9 + sVar10 + lVar15 + (ulong)uVar4 +
           (ulong)uVar6 * 8 + lVar12 + (ulong)uVar2 * 2;
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      pVVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_string_value_.super_RepeatedPtrFieldBase
                           ,uVar4);
      uVar5 = (uint)pVVar13->_M_string_length | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar15 = lVar15 + pVVar13->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  uVar4 = *(uint *)((long)&this->field_0 + 0xb8);
  lVar15 = lVar15 + (ulong)uVar4 * 2;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pVVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_bytes_value_.super_RepeatedPtrFieldBase,
                           uVar5);
      uVar6 = (uint)pVVar13->_M_string_length | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar15 = lVar15 + pVVar13->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  sVar7 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_enum_value_,2,
                     &(this->field_0)._impl_._repeated_enum_value_cached_byte_size_);
  iVar3 = *(int *)((long)&this->field_0 + 0xe8);
  this_00 = &(this->field_0)._impl_.repeated_message_value_;
  pRVar17 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0xe0) & 1) != 0) {
    pRVar14 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&this_00->super_RepeatedPtrFieldBase);
    pRVar17 = (RepeatedPtrField<proto3::MessageType> *)pRVar14->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar14 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<proto3::MessageType> *)pRVar14->elements;
    }
  }
  lVar15 = sVar7 + lVar15 + (long)iVar3 * 2;
  uVar11 = (ulong)*(int *)((long)&this->field_0 + 0xe8);
  ppvVar1 = &(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + uVar11;
  for (; pRVar17 != (RepeatedPtrField<proto3::MessageType> *)ppvVar1;
      pRVar17 = (RepeatedPtrField<proto3::MessageType> *)
                &(pRVar17->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = MessageType::ByteSizeLong
                      ((MessageType *)(pRVar17->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar7 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    uVar11 = (ulong)(iVar3 * 9 + 0x49U >> 6);
    lVar15 = lVar15 + sVar7 + uVar11;
  }
  uVar4 = *(uint *)&this->field_0;
  auVar18._0_4_ = -(uint)((uVar4 & 0xff) == 0);
  auVar18._4_4_ = -(uint)((uVar4 & 0x8000) == 0);
  auVar18._8_4_ = -(uint)((uVar4 & 0x100000) == 0);
  auVar18._12_4_ = -(uint)((uVar4 & 0x200000) == 0);
  uVar5 = movmskps((int)uVar11,auVar18);
  lVar16 = lVar15 + 10;
  if ((uVar5 & 8) != 0) {
    lVar16 = lVar15;
  }
  lVar15 = lVar16 + 6;
  if ((uVar5 & 4) != 0) {
    lVar15 = lVar16;
  }
  sVar7 = (ulong)((uVar5 & 2) == 0) * 3 + lVar15;
  if ((uVar5 & 1) == 0) {
    sVar8 = sVar7;
    if (((uVar4 & 1) != 0) &&
       (lVar15 = *(long *)(((ulong)(this->field_0)._impl_.string_value_.tagged_ptr_.ptr_ &
                           0xfffffffffffffffc) + 8), lVar15 != 0)) {
      uVar5 = (uint)lVar15 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar7 + lVar15 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if (((uVar4 & 2) != 0) &&
       (lVar15 = *(long *)(((ulong)(this->field_0)._impl_.bytes_value_.tagged_ptr_.ptr_ &
                           0xfffffffffffffffc) + 8), lVar15 != 0)) {
      uVar5 = (uint)lVar15 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + lVar15 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 4) != 0) {
      lVar15 = *(long *)(((ulong)(this->field_0)._impl_.optional_string_value_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar15 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + lVar15 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 8) != 0) {
      lVar15 = *(long *)(((ulong)(this->field_0)._impl_.optional_bytes_value_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar15 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + lVar15 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 0x10) != 0) {
      sVar7 = MessageType::ByteSizeLong((this->field_0)._impl_.message_value_);
      uVar5 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 0x20) != 0) {
      sVar7 = MessageType::ByteSizeLong((this->field_0)._impl_.optional_message_value_);
      uVar5 = (uint)sVar7 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
    }
    sVar7 = sVar8 + 2;
    if (((this->field_0)._impl_.bool_value_ & 1U) == 0) {
      sVar7 = sVar8;
    }
    if ((uVar4 & 0x40) == 0) {
      sVar7 = sVar8;
    }
    if (((char)uVar4 < '\0') && (uVar11 = (ulong)(this->field_0)._impl_.int32_value_, uVar11 != 0))
    {
      uVar11 = uVar11 | 1;
      lVar15 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar15 * 9 + 0x89U >> 6);
    }
  }
  if ((uVar4 & 0x7f00) != 0) {
    if (((uVar4 >> 8 & 1) != 0) && (uVar11 = (this->field_0)._impl_.int64_value_, uVar11 != 0)) {
      uVar11 = uVar11 | 1;
      lVar15 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar15 * 9 + 0x89U >> 6);
    }
    if (((uVar4 >> 9 & 1) != 0) && (uVar11 = (this->field_0)._impl_.uint64_value_, uVar11 != 0)) {
      uVar11 = uVar11 | 1;
      lVar15 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar15 * 9 + 0x89U >> 6);
    }
    if (((uVar4 >> 10 & 1) != 0) && (uVar5 = (this->field_0)._impl_.uint32_value_, uVar5 != 0)) {
      uVar5 = uVar5 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar3 * 9 + 0x89U >> 6);
    }
    sVar8 = sVar7 + 5;
    if ((this->field_0)._impl_.float_value_ == 0.0) {
      sVar8 = sVar7;
    }
    if ((uVar4 >> 0xb & 1) == 0) {
      sVar8 = sVar7;
    }
    sVar7 = sVar8 + 9;
    if ((this->field_0)._impl_.double_value_ == 0.0) {
      sVar7 = sVar8;
    }
    if ((uVar4 >> 0xc & 1) == 0) {
      sVar7 = sVar8;
    }
    if (((uVar4 >> 0xd & 1) != 0) &&
       (uVar11 = (ulong)(this->field_0)._impl_.enum_value_, uVar11 != 0)) {
      uVar11 = uVar11 | 1;
      lVar15 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar15 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 >> 0xe & 1) != 0) {
      uVar11 = (long)(this->field_0)._impl_.optional_enum_value_ | 1;
      lVar15 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar15 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar4 & 0xf0000) != 0) {
    if ((uVar4 >> 0x10 & 1) != 0) {
      uVar11 = (long)(this->field_0)._impl_.optional_int32_value_ | 1;
      lVar15 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar15 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 0x11 & 1) != 0) {
      uVar11 = (this->field_0)._impl_.optional_int64_value_ | 1;
      lVar15 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar15 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 0x12 & 1) != 0) {
      uVar11 = (this->field_0)._impl_.optional_uint64_value_ | 1;
      lVar15 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar15 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 0x13 & 1) != 0) {
      uVar4 = (this->field_0)._impl_.optional_uint32_value_ | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar3 * 9 + 0x49U >> 6) + 2;
    }
  }
  sVar7 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar7,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t TestMessage::ByteSizeLong() const {
  const TestMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3.TestMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated bool repeated_bool_value = 21;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_value_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated int32 repeated_int32_value = 22;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32_value(), 2,
              this_._impl_._repeated_int32_value_cached_byte_size_);
    }
    // repeated int64 repeated_int64_value = 23;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int64SizeWithPackedTagSize(
              this_._internal_repeated_int64_value(), 2,
              this_._impl_._repeated_int64_value_cached_byte_size_);
    }
    // repeated uint32 repeated_uint32_value = 24;
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt32SizeWithPackedTagSize(
              this_._internal_repeated_uint32_value(), 2,
              this_._impl_._repeated_uint32_value_cached_byte_size_);
    }
    // repeated uint64 repeated_uint64_value = 25;
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt64SizeWithPackedTagSize(
              this_._internal_repeated_uint64_value(), 2,
              this_._impl_._repeated_uint64_value_cached_byte_size_);
    }
    // repeated float repeated_float_value = 26;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_float_value_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated double repeated_double_value = 27;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_double_value_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated string repeated_string_value = 28;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_value().size());
      for (int i = 0, n = this_._internal_repeated_string_value().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_value().Get(i));
      }
    }
    // repeated bytes repeated_bytes_value = 29;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_bytes_value().size());
      for (int i = 0, n = this_._internal_repeated_bytes_value().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::BytesSize(
            this_._internal_repeated_bytes_value().Get(i));
      }
    }
    // repeated .proto3.EnumType repeated_enum_value = 30;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_enum_value(), 2, this_._impl_._repeated_enum_value_cached_byte_size_);
    }
    // repeated .proto3.MessageType repeated_message_value = 31;
    {
      total_size += 2UL * this_._internal_repeated_message_value_size();
      for (const auto& msg : this_._internal_repeated_message_value()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00200000u & cached_has_bits) * 10;
  total_size += static_cast<bool>(0x00100000u & cached_has_bits) * 6;
  total_size += static_cast<bool>(0x00008000u & cached_has_bits) * 3;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // string string_value = 8;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!this_._internal_string_value().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_string_value());
      }
    }
    // bytes bytes_value = 9;
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!this_._internal_bytes_value().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                        this_._internal_bytes_value());
      }
    }
    // optional string optional_string_value = 48;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_value());
    }
    // optional bytes optional_bytes_value = 49;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_optional_bytes_value());
    }
    // .proto3.MessageType message_value = 11;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.message_value_);
    }
    // optional .proto3.MessageType optional_message_value = 51;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_message_value_);
    }
    // bool bool_value = 1;
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (this_._internal_bool_value() != 0) {
        total_size += 2;
      }
    }
    // int32 int32_value = 2;
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (this_._internal_int32_value() != 0) {
        total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
            this_._internal_int32_value());
      }
    }
  }
  if ((cached_has_bits & 0x00007f00u) != 0) {
    // int64 int64_value = 3;
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (this_._internal_int64_value() != 0) {
        total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
            this_._internal_int64_value());
      }
    }
    // uint64 uint64_value = 5;
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (this_._internal_uint64_value() != 0) {
        total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
            this_._internal_uint64_value());
      }
    }
    // uint32 uint32_value = 4;
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (this_._internal_uint32_value() != 0) {
        total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
            this_._internal_uint32_value());
      }
    }
    // float float_value = 6;
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (::absl::bit_cast<::uint32_t>(this_._internal_float_value()) != 0) {
        total_size += 5;
      }
    }
    // double double_value = 7;
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (::absl::bit_cast<::uint64_t>(this_._internal_double_value()) != 0) {
        total_size += 9;
      }
    }
    // .proto3.EnumType enum_value = 10;
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (this_._internal_enum_value() != 0) {
        total_size += 1 +
                      ::_pbi::WireFormatLite::EnumSize(this_._internal_enum_value());
      }
    }
    // optional .proto3.EnumType optional_enum_value = 50;
    if ((cached_has_bits & 0x00004000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_enum_value());
    }
  }
  if ((cached_has_bits & 0x000f0000u) != 0) {
    // optional int32 optional_int32_value = 42;
    if ((cached_has_bits & 0x00010000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_optional_int32_value());
    }
    // optional int64 optional_int64_value = 43;
    if ((cached_has_bits & 0x00020000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int64Size(
                                      this_._internal_optional_int64_value());
    }
    // optional uint64 optional_uint64_value = 45;
    if ((cached_has_bits & 0x00040000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt64Size(
                                      this_._internal_optional_uint64_value());
    }
    // optional uint32 optional_uint32_value = 44;
    if ((cached_has_bits & 0x00080000u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_optional_uint32_value());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}